

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O0

idx_t duckdb::TemplatedMatchLoop<true,unsigned_int,duckdb::Equals,false>
                (TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                SelectionVector *no_match_sel,idx_t *no_match_count)

{
  bool bVar1;
  const_reference pvVar2;
  uchar *entry;
  TupleDataLayout *in_RCX;
  ulong in_RDX;
  SelectionVector *in_RSI;
  long in_RDI;
  idx_t in_R9;
  long *in_stack_00000010;
  bool rhs_null;
  ValidityBytes rhs_mask;
  uchar **rhs_location;
  bool lhs_null;
  idx_t lhs_idx;
  idx_t idx;
  idx_t i;
  idx_t match_count;
  idx_t idx_in_entry;
  idx_t entry_idx;
  value_type rhs_offset_in_row;
  uchar **rhs_locations;
  ValidityMask *lhs_validity;
  uint *lhs_data;
  SelectionVector *lhs_sel;
  size_type in_stack_ffffffffffffff18;
  undefined2 uVar3;
  TemplatedValidityMask<unsigned_char> *in_stack_ffffffffffffff20;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  TemplatedValidityMask<unsigned_char> local_b8;
  uchar **local_98;
  undefined1 local_89;
  idx_t local_88;
  idx_t local_80;
  ulong local_78;
  idx_t local_70;
  idx_t local_68;
  idx_t local_60;
  value_type local_58;
  uchar **local_50;
  long local_48;
  uint *local_40;
  SelectionVector *local_38;
  idx_t local_30;
  TupleDataLayout *local_20;
  ulong local_18;
  SelectionVector *local_10;
  long local_8;
  
  local_38 = *(SelectionVector **)(in_RDI + 0x20);
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = UnifiedVectorFormat::GetData<unsigned_int>((UnifiedVectorFormat *)(in_RDI + 0x20));
  local_48 = local_8 + 0x30;
  local_50 = FlatVector::GetData<unsigned_char*>((Vector *)0x15b6139);
  TupleDataLayout::GetOffsets(local_20);
  pvVar2 = vector<unsigned_long,_true>::operator[]
                     ((vector<unsigned_long,_true> *)in_stack_ffffffffffffff20,
                      in_stack_ffffffffffffff18);
  local_58 = *pvVar2;
  TemplatedValidityMask<unsigned_char>::GetEntryIndex(local_30,&local_60,&local_68);
  local_70 = 0;
  for (local_78 = 0; local_78 < local_18; local_78 = local_78 + 1) {
    local_80 = SelectionVector::get_index(local_10,local_78);
    local_88 = SelectionVector::get_index(local_38,local_80);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffff28,(idx_t)in_stack_ffffffffffffff20);
    local_89 = !bVar1;
    local_98 = local_50 + local_80;
    uVar3 = (undefined2)((ulong)*local_98 >> 0x30);
    TupleDataLayout::ColumnCount((TupleDataLayout *)0x15b6220);
    in_stack_ffffffffffffff20 = &local_b8;
    TemplatedValidityMask<unsigned_char>::TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (uchar *)in_stack_ffffffffffffff28,(idx_t)in_stack_ffffffffffffff20);
    entry = TemplatedValidityMask<unsigned_char>::GetValidityEntryUnsafe
                      (in_stack_ffffffffffffff20,local_60);
    TemplatedValidityMask<unsigned_char>::RowIsValid(entry,&local_68);
    in_stack_ffffffffffffff28 = (TemplatedValidityMask<unsigned_long> *)(local_40 + local_88);
    Load<unsigned_int>(*local_98 + local_58);
    bVar1 = ComparisonOperationWrapper<duckdb::Equals>::Operation<unsigned_int>
                      ((uint *)in_stack_ffffffffffffff28,(uint *)in_stack_ffffffffffffff20,
                       SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
    in_stack_ffffffffffffff30 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
    if (bVar1) {
      local_70 = local_70 + 1;
      SelectionVector::set_index
                ((SelectionVector *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (idx_t)in_stack_ffffffffffffff28,(idx_t)in_stack_ffffffffffffff20);
    }
    else {
      *in_stack_00000010 = *in_stack_00000010 + 1;
      SelectionVector::set_index
                ((SelectionVector *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (idx_t)in_stack_ffffffffffffff28,(idx_t)in_stack_ffffffffffffff20);
    }
    TemplatedValidityMask<unsigned_char>::~TemplatedValidityMask
              ((TemplatedValidityMask<unsigned_char> *)0x15b632f);
  }
  return local_70;
}

Assistant:

static idx_t TemplatedMatchLoop(const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                                const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                                SelectionVector *no_match_sel, idx_t &no_match_count) {
	using COMPARISON_OP = ComparisonOperationWrapper<OP>;

	// LHS
	const auto &lhs_sel = *lhs_format.unified.sel;
	const auto lhs_data = UnifiedVectorFormat::GetData<T>(lhs_format.unified);
	const auto &lhs_validity = lhs_format.unified.validity;

	// RHS
	const auto rhs_locations = FlatVector::GetData<data_ptr_t>(rhs_row_locations);
	const auto rhs_offset_in_row = rhs_layout.GetOffsets()[col_idx];
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	idx_t match_count = 0;
	for (idx_t i = 0; i < count; i++) {
		const auto idx = sel.get_index(i);

		const auto lhs_idx = lhs_sel.get_index(idx);
		const auto lhs_null = LHS_ALL_VALID ? false : !lhs_validity.RowIsValid(lhs_idx);

		const auto &rhs_location = rhs_locations[idx];
		const ValidityBytes rhs_mask(rhs_location, rhs_layout.ColumnCount());
		const auto rhs_null = !rhs_mask.RowIsValid(rhs_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry);

		if (COMPARISON_OP::template Operation<T>(lhs_data[lhs_idx], Load<T>(rhs_location + rhs_offset_in_row), lhs_null,
		                                         rhs_null)) {
			sel.set_index(match_count++, idx);
		} else if (NO_MATCH_SEL) {
			no_match_sel->set_index(no_match_count++, idx);
		}
	}
	return match_count;
}